

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nocpout.c
# Opt level: O0

void decode_ustr(Symbol *sym,double *pg1,double *pg2,char *s)

{
  char cVar1;
  char *pcVar2;
  char *in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  char *cp1;
  char *cp;
  int n;
  int i;
  char *in_stack_ffffffffffffffb8;
  char *local_38;
  char *local_30;
  int local_28;
  int local_24;
  
  pcVar2 = (char *)((ulong)((uint)*(undefined8 *)(in_RDI + 8) & 0x1e) - 2);
  switch(pcVar2) {
  case (char *)0x0:
    if ((in_RDI == 0) || (*(long *)(in_RDI + 0x28) == 0)) {
      __assert_fail("sym && sym->u.str",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/BlueBrain[P]mod2c/src/mod2c_core/nocpout.c"
                    ,0x72f,"void decode_ustr()");
    }
    if ((*(ulong *)(in_RDI + 8) & 0x20) == 0) {
      local_24 = __isoc99_sscanf(*(undefined8 *)(in_RDI + 0x28),"%lf\n%s",in_RSI,in_RCX);
    }
    else {
      local_24 = __isoc99_sscanf(*(undefined8 *)(in_RDI + 0x28),"[%*d]\n%lf\n%s",in_RSI,in_RCX);
    }
    if (local_24 == 1) {
      *in_RCX = '\0';
      local_24 = 2;
    }
    if (local_24 != 2) {
      __assert_fail("i == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/BlueBrain[P]mod2c/src/mod2c_core/nocpout.c"
                    ,0x739,"void decode_ustr()");
    }
    break;
  case (char *)0x2:
  case (char *)0x6:
  case (char *)0xe:
    if ((in_RDI == 0) || (*(long *)(in_RDI + 0x28) == 0)) {
      __assert_fail("sym && sym->u.str",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/BlueBrain[P]mod2c/src/mod2c_core/nocpout.c"
                    ,0x71c,"void decode_ustr()");
    }
    if ((*(ulong *)(in_RDI + 8) & 0x20) == 0) {
      local_24 = __isoc99_sscanf(*(undefined8 *)(in_RDI + 0x28),"%lf%*c%lf",in_RSI,in_RDX);
    }
    else {
      local_24 = __isoc99_sscanf(*(undefined8 *)(in_RDI + 0x28),"[%*d]\n%lf%*c%lf",in_RSI,in_RDX);
    }
    if (local_24 != 2) {
      __assert_fail("i == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/BlueBrain[P]mod2c/src/mod2c_core/nocpout.c"
                    ,0x722,"void decode_ustr()");
    }
    local_28 = 0;
    local_30 = *(char **)(in_RDI + 0x28);
    while (local_38 = in_RCX, local_28 < 2) {
      pcVar2 = local_30 + 1;
      cVar1 = *local_30;
      local_30 = pcVar2;
      if (cVar1 == '\n') {
        local_28 = local_28 + 1;
      }
    }
    while (*local_30 != '\n') {
      *local_38 = *local_30;
      local_38 = local_38 + 1;
      local_30 = local_30 + 1;
    }
    *local_38 = '\0';
    break;
  default:
    diag(pcVar2,in_stack_ffffffffffffffb8);
  }
  if (*in_RCX == '0') {
    *in_RCX = '\0';
  }
  return;
}

Assistant:

void decode_ustr(sym, pg1, pg2, s)	/* decode sym->u.str */
	Symbol *sym;
	char *s;
	double *pg1, *pg2;
{
	int i, n;
	char *cp, *cp1;
	
	switch (sym->subtype & (INDEP | DEP | STAT | PARM)) {

	case INDEP:	/* but doesnt get all info */
	case DEP:
	case STAT:
		assert(sym && sym->u.str);
		if (sym->subtype & ARRAY) { /* see parsact.c */
			i = sscanf(sym->u.str, "[%*d]\n%lf%*c%lf", pg1, pg2);
		}else{			
			i = sscanf(sym->u.str, "%lf%*c%lf", pg1, pg2);
		}
		assert(i == 2);
		for (n=0, cp = sym->u.str; n < 2;) {
			if (*cp++ == '\n') {
				n++;
			}
		}
		for (cp1 = s; *cp != '\n';) {
			*cp1++ = *cp++;
		}
		*cp1 = '\0';
		break;

	case PARM:
		assert(sym && sym->u.str);
		if (sym->subtype & ARRAY) { /* see parsact.c */
			i = sscanf(sym->u.str, "[%*d]\n%lf\n%s", pg1, s);
		}else{			
			i = sscanf(sym->u.str, "%lf\n%s", pg1, s);
		}
		if (i == 1) {
			s[0] = '\0';
			i = 2;
		}
		assert(i == 2);
		break;
	default:
		diag(sym->name, " does not have a proper declaration");
	}
	if (s[0] == '0') {s[0] = '\0';}
}